

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O1

QMap<int,_QVariant> __thiscall
RoleMaskProxyModel::itemData(RoleMaskProxyModel *this,QModelIndex *index)

{
  _Rb_tree_node_base *key;
  RoleMaskProxyModelPrivate *this_00;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  QVar1;
  Data<QHashPrivate::Node<int,_QHashDummyValue>_> *this_01;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar2;
  bool bVar3;
  long lVar4;
  FlaggedRolesContainer *pFVar5;
  long *plVar6;
  Node<int,_QHashDummyValue> *pNVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  int *in_RDX;
  _Rb_tree_node_base *p_Var12;
  RolesContainer result;
  QMap<int,_QVariant> baseData;
  QModelIndex sourceIdx;
  QMap<int,_QVariant> local_58;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  local_50;
  QModelIndex local_48;
  
  if ((((*in_RDX < 0) || (in_RDX[1] < 0)) || (*(long *)(in_RDX + 4) == 0)) ||
     (lVar4 = QAbstractProxyModel::sourceModel(), lVar4 == 0)) {
    *(undefined8 *)this = 0;
  }
  else {
    this_00 = (RoleMaskProxyModelPrivate *)index->m;
    local_58.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0x0;
    (**(code **)(*(long *)index + 400))(&local_48,index);
    pFVar5 = RoleMaskProxyModelPrivate::dataForIndex(this_00,&local_48);
    if (pFVar5 != (FlaggedRolesContainer *)0x0) {
      QVar1.d = (pFVar5->roles).d.d;
      if (QVar1.d !=
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        LOCK();
        ((QVar1.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)((QVar1.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      local_50 = local_58.d.d;
      local_58.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                        )QVar1.d;
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_50);
      if (local_58.d.d ==
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        p_Var9 = (_Base_ptr)0x0;
      }
      else {
        p_Var9 = (_Base_ptr)((long)local_58.d.d + 0x10);
        p_Var10 = p_Var9;
        for (p_Var11 = *(_Base_ptr *)((long)local_58.d.d + 0x18); p_Var11 != (_Base_ptr)0x0;
            p_Var11 = (&p_Var11->_M_left)[p_Var11[1]._M_color >> 0x1f]) {
          if (-1 < (int)p_Var11[1]._M_color) {
            p_Var10 = p_Var11;
          }
        }
        if ((p_Var10 != p_Var9) && ((int)p_Var10[1]._M_color < 1)) {
          p_Var9 = p_Var10;
        }
      }
      p_Var11 = (_Base_ptr)((long)local_58.d.d + 0x10);
      if (local_58.d.d ==
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        p_Var11 = (_Base_ptr)0x0;
      }
      if ((this_00->m_mergeDisplayEdit == true) && (p_Var9 != p_Var11)) {
        local_50.d._0_4_ = 2;
        QMap<int,_QVariant>::detach(&local_58);
        std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
        insert_or_assign<QVariant_const&>
                  ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>> *
                   )((long)local_58.d.d + 8),(key_type *)&local_50,(QVariant *)&p_Var9[1]._M_parent)
        ;
      }
    }
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    (**(code **)(*plVar6 + 0xb0))(&local_50,plVar6,&local_48);
    if (local_50.d ==
        (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)0x0) {
      p_Var8 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var8 = ((local_50.d)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    p_Var12 = &((local_50.d)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (local_50.d ==
        (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)0x0) {
      p_Var12 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var8 != p_Var12; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      key = p_Var8 + 1;
      bVar3 = QMap<int,_QVariant>::contains(&local_58,(int *)key);
      if ((!bVar3) &&
         (((this_01 = (this_00->m_maskedRoles).q_hash.d,
           this_01 == (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0 ||
           (pNVar7 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode
                               (this_01,(Key *)key), pNVar7 == (Node<int,_QHashDummyValue> *)0x0))
          || (this_00->m_transparentIfEmpty == true)))) {
        QMap<int,_QVariant>::detach(&local_58);
        std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
        insert_or_assign<QVariant_const&>
                  ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>> *
                   )((long)local_58.d.d + 8),(key_type *)key,(QVariant *)&p_Var8[1]._M_parent);
      }
    }
    if (this_00->m_transparentIfEmpty == false) {
      pQVar2 = (this_00->m_defaultValues).d.d;
      if (pQVar2 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var9 = (_Base_ptr)0x0;
      }
      else {
        p_Var9 = (pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var8 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar2 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var8 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var9 != p_Var8; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        bVar3 = QMap<int,_QVariant>::contains(&local_58,(int *)(p_Var9 + 1));
        if (!bVar3) {
          QMap<int,_QVariant>::detach(&local_58);
          std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
          insert_or_assign<QVariant_const&>
                    ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>
                      *)((long)local_58.d.d + 8),(key_type *)(p_Var9 + 1),
                     (QVariant *)&p_Var9[1]._M_parent);
        }
      }
    }
    *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      *)this = local_58.d.d;
    if (local_58.d.d !=
        (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)0x0) {
      LOCK();
      *(int *)local_58.d.d = *(int *)local_58.d.d + 1;
      UNLOCK();
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_50);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_58.d);
  }
  return (QMap<int,_QVariant>)
         (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )this;
}

Assistant:

QMap<int, QVariant> RoleMaskProxyModel::itemData(const QModelIndex &index) const
{
    if (!index.isValid() || !sourceModel())
        return QMap<int, QVariant>();
    Q_D(const RoleMaskProxyModel);
    RolesContainer result;
    const QModelIndex sourceIdx = mapToSource(index);
    const FlaggedRolesContainer *maskedData = d->dataForIndex(sourceIdx);
    if (maskedData) {
        result = maskedData->roles;
        const auto displayIter = result.constFind(Qt::DisplayRole);
        if (d->m_mergeDisplayEdit && displayIter != result.cend())
            result.insert(Qt::EditRole, displayIter.value());
    }
    const QMap<int, QVariant> baseData = sourceModel()->itemData(sourceIdx);
    for (auto i = baseData.cbegin(), baseEnd = baseData.cend(); i != baseEnd; ++i) {
        if (!result.contains(i.key()) && (!d->m_maskedRoles.contains(i.key()) || d->m_transparentIfEmpty))
            result.insert(i.key(), i.value());
    }
    if (!d->m_transparentIfEmpty) {
        for (auto i = d->m_defaultValues.cbegin(), iEnd = d->m_defaultValues.cend(); i != iEnd; ++i) {
            if (!result.contains(i.key()))
                result.insert(i.key(), i.value());
        }
    }
    return convertFromContainer<QMap<int, QVariant>>(result);
}